

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O0

void textui_process_command(void)

{
  unkuint9 Var1;
  _Bool _Var2;
  uint8_t uVar5;
  bool bVar3;
  ui_event uVar4;
  keypress kp;
  char *local_88;
  char *em;
  cmd_info *pcStack_60;
  char nestkey;
  ui_event_type local_58;
  cmd_info *local_50;
  ui_event_type local_48;
  uint local_40;
  byte local_39;
  wchar_t mode;
  uchar key;
  cmd_info *cmd;
  ui_event_type local_28;
  cmd_info *local_20;
  ui_event e;
  wchar_t local_c;
  _Bool done;
  wchar_t count;
  
  local_c = L'\0';
  e._11_1_ = 1;
  uVar4 = textui_get_command(&local_c);
  local_50 = uVar4._0_8_;
  local_28 = CONCAT31(local_28._1_3_,uVar4.key.mods);
  e.type = local_28;
  _mode = (cmd_info *)0x0;
  local_39 = 0;
  local_40 = (player->opts).opt[1] & 1;
  local_20._0_4_ = uVar4.type;
  Var1 = uVar4._0_9_;
  cmd = local_50;
  local_20 = local_50;
  switch((ui_event_type)local_20) {
  case EVT_KBRD:
  case EVT_BUTTON:
    local_58 = local_28;
    kp._9_3_ = 0;
    kp.type = (int)Var1;
    kp.code = (int)(Var1 >> 0x20);
    register0x00000030 = (char)(Var1 >> 0x40);
    pcStack_60 = local_50;
    e._11_1_ = textui_process_key(kp,&local_39,local_c);
    break;
  case EVT_MOUSE:
    local_48 = local_28;
    uVar4._9_3_ = 0;
    uVar4._0_9_ = Var1;
    textui_process_click(uVar4);
    return;
  default:
    break;
  case EVT_RESIZE:
    do_cmd_redraw();
    return;
  }
  if ((local_39 != 0) || ((e._11_1_ & 1) == 0)) {
    if (local_39 == 0x9c) {
      _mode = textui_action_menu_choose();
    }
    else {
      _mode = converted_list[(int)local_40][local_39];
    }
    if ((_mode == (cmd_info *)0x0) || ((e._11_1_ & 1) == 0)) {
      do_cmd_unknown();
    }
    else {
      if ((_mode->cmd == CMD_NULL) && (_mode->hook == (_func_void *)0x0)) {
        while( true ) {
          bVar3 = false;
          if ((_mode != (cmd_info *)0x0) && (bVar3 = false, _mode->cmd == CMD_NULL)) {
            bVar3 = _mode->hook == (_func_void *)0x0;
          }
          if (!bVar3) break;
          if (((_mode->nested_keymap < 1) || (n_nested < _mode->nested_keymap)) ||
             (_mode->nested_prompt == (char *)0x0)) {
            _mode = (cmd_info *)0x0;
          }
          else {
            _Var2 = get_com(_mode->nested_prompt,(char *)((long)&em + 7));
            if (_Var2) {
              local_88 = _mode->nested_error;
              _mode = nested_lists[_mode->nested_keymap + -1][em._7_1_];
              if (_mode == (cmd_info *)0x0) {
                if (local_88 == (char *)0x0) {
                  local_88 = "That is not a valid nested command.";
                }
                msg("%s",local_88);
              }
            }
            else {
              _mode = (cmd_info *)0x0;
            }
          }
        }
      }
      else {
        _Var2 = key_confirm_command(local_39);
        if (!_Var2) {
          _mode = (cmd_info *)0x0;
        }
      }
      if (((_mode != (cmd_info *)0x0) && (_mode->prereq != (_func__Bool *)0x0)) &&
         (_Var2 = (*_mode->prereq)(), !_Var2)) {
        _mode = (cmd_info *)0x0;
      }
      if ((_mode == (cmd_info *)0x0) || (_mode->hook == (_func_void *)0x0)) {
        if ((_mode != (cmd_info *)0x0) && (_mode->cmd != CMD_NULL)) {
          cmdq_push_repeat(_mode->cmd,local_c);
        }
      }
      else {
        (*_mode->hook)();
      }
    }
  }
  return;
}

Assistant:

void textui_process_command(void)
{
	int count = 0;
	bool done = true;
	ui_event e = textui_get_command(&count);
	struct cmd_info *cmd = NULL;
	unsigned char key = '\0';
	int mode = OPT(player, rogue_like_commands) ? KEYMAP_MODE_ROGUE : KEYMAP_MODE_ORIG;

	switch (e.type) {
		case EVT_RESIZE: do_cmd_redraw(); return;
		case EVT_MOUSE: textui_process_click(e); return;
		case EVT_BUTTON:
		case EVT_KBRD: done = textui_process_key(e.key, &key, count); break;
		default: ;
	}

	/* Null command */
	if (!key && done)
		return;

	if (key == KC_ENTER) {
		/* Use command menus */
		cmd = textui_action_menu_choose();
	} else {
		/* Command key */
		cmd = converted_list[mode][key];
	}

	if (cmd && done) {
		if (cmd->cmd || cmd->hook) {
			/* Confirm for worn equipment inscriptions. */
			if (!key_confirm_command(key)) cmd = NULL;
		} else {
			/*
			 * It refers to nested commands.  Get the nested
			 * command.  Those aren't subject to keymaps and
			 * inherit the count.
			 */
			while (cmd && !cmd->cmd && !cmd->hook) {
				char nestkey;

				if (cmd->nested_keymap > 0 &&
						cmd->nested_keymap <= n_nested &&
						cmd->nested_prompt) {
					if (get_com(cmd->nested_prompt, &nestkey)) {
						const char* em =
							cmd->nested_error;

						cmd = nested_lists[cmd->nested_keymap - 1][(unsigned char) nestkey];
						if (!cmd) {
							msg("%s", em ? em : "That is not a valid nested command.");
						}
					} else {
						cmd = NULL;
					}
				} else {
					cmd = NULL;
				}
			}
		}

		/* Check prereqs. */
		if (cmd && cmd->prereq && !cmd->prereq()) cmd = NULL;

		/* Split on type of command */
		if (cmd && cmd->hook)
			/* UI command */
			cmd->hook();
		else if (cmd && cmd->cmd)
			/* Game command */
			cmdq_push_repeat(cmd->cmd, count);
	} else
		/* Error */
		do_cmd_unknown();
}